

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O1

void __thiscall GlobalMemoryAccountant::start(GlobalMemoryAccountant *this)

{
  TestMemoryAllocator *pTVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  AccountingTestMemoryAllocator *pAVar4;
  
  if (this->mallocAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x1a])
              (pUVar2,"Global allocator start called twice!",
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2db,pTVar3);
  }
  pAVar4 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2dd);
  if (currentMallocAllocator == (TestMemoryAllocator *)0x0) {
    defaultMallocAllocator();
    currentMallocAllocator = &defaultMallocAllocator::allocator;
  }
  pTVar1 = currentMallocAllocator;
  (pAVar4->super_TestMemoryAllocator).name_ = "generic";
  (pAVar4->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar4->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar4->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar4->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_003a7358;
  pAVar4->accountant_ = &this->accountant_;
  pAVar4->originalAllocator_ = pTVar1;
  pAVar4->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->mallocAllocator_ = pAVar4;
  pAVar4 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2de);
  if (currentNewAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewAllocator();
    currentNewAllocator = &defaultNewAllocator::allocator;
  }
  pTVar1 = currentNewAllocator;
  (pAVar4->super_TestMemoryAllocator).name_ = "generic";
  (pAVar4->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar4->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar4->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar4->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_003a7358;
  pAVar4->accountant_ = &this->accountant_;
  pAVar4->originalAllocator_ = pTVar1;
  pAVar4->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->newAllocator_ = pAVar4;
  pAVar4 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2df);
  if (currentNewArrayAllocator == (TestMemoryAllocator *)0x0) {
    defaultNewArrayAllocator();
    currentNewArrayAllocator = &defaultNewArrayAllocator::allocator;
  }
  pTVar1 = currentNewArrayAllocator;
  (pAVar4->super_TestMemoryAllocator).name_ = "generic";
  (pAVar4->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar4->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar4->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar4->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_003a7358;
  pAVar4->accountant_ = &this->accountant_;
  pAVar4->originalAllocator_ = pTVar1;
  pAVar4->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->newArrayAllocator_ = pAVar4;
  if (currentMallocAllocator == (TestMemoryAllocator *)0x0) {
    defaultMallocAllocator();
    currentMallocAllocator = &defaultMallocAllocator::allocator;
  }
  (this->accountant_).allocator_ = currentMallocAllocator;
  currentMallocAllocator = &this->mallocAllocator_->super_TestMemoryAllocator;
  currentNewAllocator = &this->newAllocator_->super_TestMemoryAllocator;
  currentNewArrayAllocator = &this->newArrayAllocator_->super_TestMemoryAllocator;
  return;
}

Assistant:

void GlobalMemoryAccountant::start()
{
    if (mallocAllocator_ != NULLPTR)
      FAIL("Global allocator start called twice!");

    mallocAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentMallocAllocator());
    newAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewAllocator());
    newArrayAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewArrayAllocator());

    accountant_.setAllocator(getCurrentMallocAllocator());

    setCurrentMallocAllocator(mallocAllocator_);
    setCurrentNewAllocator(newAllocator_);
    setCurrentNewArrayAllocator(newArrayAllocator_);
}